

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreEvaluators.h
# Opt level: O0

CoeffReturnType __thiscall
Eigen::internal::
unary_evaluator<Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_-1,_1>,_Eigen::internal::IndexBased,_double>
::coeff(unary_evaluator<Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>,_Eigen::internal::IndexBased,_double>
        *this,Index row,Index col)

{
  long lVar1;
  CoeffReturnType pdVar2;
  Index actual_col;
  Index actual_row;
  Index col_local;
  Index row_local;
  unary_evaluator<Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,__1,_1>,_Eigen::internal::IndexBased,_double>
  *this_local;
  
  lVar1 = variable_if_dynamic<long,_1>::value();
  pdVar2 = unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::internal::IndexBased,_double>
           ::coeff(&(this->m_argImpl).
                    super_unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::internal::IndexBased,_double>
                   ,row % lVar1,col);
  return *pdVar2;
}

Assistant:

CoeffReturnType coeff(Index row, Index col) const
  {
    // try to avoid using modulo; this is a pure optimization strategy
    const Index actual_row = internal::traits<XprType>::RowsAtCompileTime==1 ? 0
                           : RowFactor==1 ? row
                           : row % m_rows.value();
    const Index actual_col = internal::traits<XprType>::ColsAtCompileTime==1 ? 0
                           : ColFactor==1 ? col
                           : col % m_cols.value();

    return m_argImpl.coeff(actual_row, actual_col);
  }